

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  undefined8 uVar4;
  undefined8 *__size;
  char *pcVar5;
  long lVar6;
  undefined1 auVar7 [16];
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_88;
  long local_80;
  undefined1 local_78 [5] [16];
  
  __size = &local_88;
  if (pinger->vectored_writes == 0) {
    local_78[0] = uv_buf_init(PING,5);
    uVar4 = 1;
  }
  else {
    pcVar5 = PING;
    lVar6 = 8;
    do {
      auVar7 = uv_buf_init(pcVar5,1);
      *(long *)(local_78[-1] + lVar6 + 8) = auVar7._0_8_;
      *(long *)(local_78[0] + lVar6) = auVar7._8_8_;
      pcVar5 = pcVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x58);
    uVar4 = 5;
  }
  puVar2 = (undefined8 *)malloc(200);
  if (puVar2 == (undefined8 *)0x0) {
    pinger_write_ping_cold_2();
  }
  else {
    *puVar2 = 0;
    iVar1 = uv_write(puVar2,&pinger->stream,local_78,uVar4,pinger_after_write);
    local_80 = (long)iVar1;
    local_88 = 0;
    if (local_80 == 0) {
      puts("PING");
      return;
    }
  }
  pinger_write_ping_cold_1();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_stream_t* stream;
  uv_write_t* req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  stream = (uv_stream_t*) &pinger->stream.tcp;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  req->data = NULL;
  ASSERT_OK(uv_write(req, stream, bufs, nbufs, pinger_after_write));

  puts("PING");
}